

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

int LocaleIndependentAtoi<int>(string_view str)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  string_view sVar4;
  __integer_from_chars_result_type<int> _Var5;
  string_view local_28;
  int result;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4._M_str = " \f\n\r\t\v";
  sVar4._M_len = 6;
  local_28 = util::TrimStringView(str,sVar4);
  pcVar3 = local_28._M_str;
  if (local_28._M_len == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pcVar3;
    sVar4 = (string_view)(auVar1 << 0x40);
  }
  else {
    sVar4 = local_28;
    if (*pcVar3 == '+') {
      if ((local_28._M_len != 1) && (iVar2 = 0, pcVar3[1] == '-')) goto LAB_00119d9e;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_28,1,0xffffffffffffffff);
      local_28 = sVar4;
    }
  }
  _Var5 = std::from_chars<int>(sVar4._M_str,sVar4._M_str + sVar4._M_len,&result,10);
  iVar2 = result;
  if ((_Var5.ec != 0) && (iVar2 = 0, _Var5.ec == result_out_of_range)) {
    if (local_28._M_len != 0) {
      iVar2 = -0x80000000;
      if (*local_28._M_str == '-') goto LAB_00119d9e;
    }
    iVar2 = 0x7fffffff;
  }
LAB_00119d9e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}